

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::subject::
CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test::TestBody
          (CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  string local_40;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"EURGBP","");
  bVar2 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
  local_20[0] = (internal)(bVar2 ^ 1);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    bVar3 = true;
    if (bVar2 != 0) goto LAB_001875bf;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    bVar3 = true;
    if (((byte)local_20[0] & 1) == 0) {
LAB_001875bf:
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_20,(AssertionResult *)"Currencies::IsValidCurrency(\"EURGBP\")",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x34,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      bVar3 = false;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (!bVar3) {
    return;
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"EURJPY","");
  bVar2 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
  local_20[0] = (internal)(bVar2 ^ 1);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    bVar3 = true;
    if (bVar2 != 0) goto LAB_001876df;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    bVar3 = true;
    if (((byte)local_20[0] & 1) == 0) {
LAB_001876df:
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_20,(AssertionResult *)"Currencies::IsValidCurrency(\"EURJPY\")",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x35,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      bVar3 = false;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (!bVar3) {
    return;
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AUDNZD","");
  bVar2 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
  local_20[0] = (internal)(bVar2 ^ 1);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    bVar3 = true;
    if (bVar2 == 0) goto LAB_001878a5;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    bVar3 = true;
    if (((byte)local_20[0] & 1) != 0) goto LAB_001878a5;
  }
  testing::Message::Message((Message *)&local_50);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,local_20,(AssertionResult *)"Currencies::IsValidCurrency(\"AUDNZD\")","true",
             "false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
             ,0x36,local_40._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (((local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     (local_50.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_50.ptr_ + 8))();
  }
  bVar3 = false;
LAB_001878a5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (bVar3) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"USDEUR","");
    bVar2 = bidfx_public_api::price::Currencies::IsValidCurrency((string *)&local_40);
    local_20[0] = (internal)(bVar2 ^ 1);
    local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (bVar2 != 0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_20,(AssertionResult *)"Currencies::IsValidCurrency(\"USDEUR\")",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x37,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(CurrenciesTest, test_empty_string_is_not_valid_currency_pair)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair(""));
}